

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int set_uid_option(mg_context *phys_ctx)

{
  __uid_t _Var1;
  int iVar2;
  passwd *ppVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  uint in_ECX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *func;
  char *fmt;
  
  _Var1 = getuid();
  pcVar6 = (phys_ctx->dd).config[2];
  if (pcVar6 == (char *)0x0) {
    return 1;
  }
  ppVar3 = getpwnam(pcVar6);
  if (ppVar3 == (passwd *)0x0) {
    fmt = "%s: unknown user [%s]";
    pcVar5 = extraout_RDX;
  }
  else {
    if (_Var1 == ppVar3->pw_uid) {
      return 1;
    }
    iVar2 = setgid(ppVar3->pw_gid);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      in_ECX = (uint)pcVar5;
      fmt = "%s: setgid(%s): %s";
      pcVar5 = extraout_RDX_01;
    }
    else {
      iVar2 = setgroups(0,(__gid_t *)0x0);
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        pcVar6 = strerror(*piVar4);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,func,(uint)pcVar6,"%s: setgroups(): %s",
                   "set_uid_option",pcVar6);
        return 0;
      }
      iVar2 = setuid(ppVar3->pw_uid);
      if (iVar2 != -1) {
        return 1;
      }
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      in_ECX = (uint)pcVar5;
      fmt = "%s: setuid(%s): %s";
      pcVar5 = extraout_RDX_00;
    }
  }
  mg_cry_internal_wrap((mg_connection *)0x0,phys_ctx,pcVar5,in_ECX,fmt,"set_uid_option",pcVar6);
  return 0;
}

Assistant:

static int
set_uid_option(struct mg_context *phys_ctx)
{
	int success = 0;

	if (phys_ctx) {
		/* We are currently running as curr_uid. */
		const uid_t curr_uid = getuid();
		/* If set, we want to run as run_as_user. */
		const char *run_as_user = phys_ctx->dd.config[RUN_AS_USER];
		const struct passwd *to_pw = NULL;

		if ((run_as_user != NULL) && (to_pw = getpwnam(run_as_user)) == NULL) {
			/* run_as_user does not exist on the system. We can't proceed
			 * further. */
			mg_cry_ctx_internal(phys_ctx,
			                    "%s: unknown user [%s]",
			                    __func__,
			                    run_as_user);
		} else if ((run_as_user == NULL) || (curr_uid == to_pw->pw_uid)) {
			/* There was either no request to change user, or we're already
			 * running as run_as_user. Nothing else to do.
			 */
			success = 1;
		} else {
			/* Valid change request.  */
			if (setgid(to_pw->pw_gid) == -1) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: setgid(%s): %s",
				                    __func__,
				                    run_as_user,
				                    strerror(errno));
			} else if (setgroups(0, NULL) == -1) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: setgroups(): %s",
				                    __func__,
				                    strerror(errno));
			} else if (setuid(to_pw->pw_uid) == -1) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: setuid(%s): %s",
				                    __func__,
				                    run_as_user,
				                    strerror(errno));
			} else {
				success = 1;
			}
		}
	}

	return success;
}